

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_FeatureExtensions_Test::
TestBody(CommandLineInterfaceTest_FeatureExtensions_Test *this)

{
  Descriptor *pDVar1;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view contents;
  string_view contents_00;
  string_view contents_01;
  string local_50;
  string local_30;
  
  pDVar1 = DescriptorProto::GetDescriptor();
  FileDescriptor::DebugString_abi_cxx11_(&local_30,pDVar1->file_);
  name._M_str = "google/protobuf/descriptor.proto";
  name._M_len = 0x20;
  contents._M_str = local_30._M_dataplus._M_p;
  contents._M_len = local_30._M_string_length;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  std::__cxx11::string::~string((string *)&local_30);
  name_00._M_str = "features.proto";
  name_00._M_len = 0xe;
  contents_00._M_str =
       "\n    syntax = \"proto2\";\n    package pb;\n    import \"google/protobuf/descriptor.proto\";\n    extend google.protobuf.FeatureSet {\n      optional TestFeatures test = 9999;\n    }\n    message TestFeatures {\n      optional int32 int_feature = 1 [\n        retention = RETENTION_RUNTIME,\n        targets = TARGET_TYPE_FIELD,\n        edition_defaults = { edition: EDITION_2023, value: \"3\" }\n      ];\n    }"
  ;
  contents_00._M_len = 0x18b;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name_00,contents_00)
  ;
  name_01._M_str = "foo.proto";
  name_01._M_len = 9;
  contents_01._M_str =
       "\n    edition = \"2023\";\n    import \"features.proto\";\n    message Foo {\n      int32 bar = 1;\n      int32 baz = 2 [features.(pb.test).int_feature = 5];\n    }"
  ;
  contents_01._M_len = 0x9a;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name_01,contents_01)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "protocol_compiler --proto_path=$tmpdir --test_out=$tmpdir foo.proto",
             (allocator<char> *)&local_30);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, FeatureExtensions) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  CreateTempFile("features.proto",
                 R"schema(
    syntax = "proto2";
    package pb;
    import "google/protobuf/descriptor.proto";
    extend google.protobuf.FeatureSet {
      optional TestFeatures test = 9999;
    }
    message TestFeatures {
      optional int32 int_feature = 1 [
        retention = RETENTION_RUNTIME,
        targets = TARGET_TYPE_FIELD,
        edition_defaults = { edition: EDITION_2023, value: "3" }
      ];
    })schema");
  CreateTempFile("foo.proto",
                 R"schema(
    edition = "2023";
    import "features.proto";
    message Foo {
      int32 bar = 1;
      int32 baz = 2 [features.(pb.test).int_feature = 5];
    })schema");

  Run("protocol_compiler --proto_path=$tmpdir --test_out=$tmpdir foo.proto");
  ExpectNoErrors();
}